

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9StreamReadWholeFile(void *pHandle,jx9_io_stream *pStream,SyBlob *pOut)

{
  sxi32 sVar1;
  undefined1 local_2028 [4];
  int rc;
  char zBuf [8192];
  jx9_int64 nRead;
  SyBlob *pOut_local;
  jx9_io_stream *pStream_local;
  void *pHandle_local;
  
  do {
    zBuf._8184_8_ = (*pStream->xRead)(pHandle,local_2028,0x2000);
    if ((long)zBuf._8184_8_ < 1) break;
    sVar1 = SyBlobAppend(pOut,local_2028,(sxu32)zBuf._8184_8_);
  } while (sVar1 == 0);
  sVar1 = -1;
  if (pOut->nByte != 0) {
    sVar1 = 0;
  }
  return sVar1;
}

Assistant:

JX9_PRIVATE sxi32 jx9StreamReadWholeFile(void *pHandle, const jx9_io_stream *pStream, SyBlob *pOut)
{
	jx9_int64 nRead;
	char zBuf[8192]; /* 8K */
	int rc;
	/* Perform the requested operation */
	for(;;){
		nRead = pStream->xRead(pHandle, zBuf, sizeof(zBuf));
		if( nRead < 1 ){
			/* EOF or IO error */
			break;
		}
		/* Append contents */
		rc = SyBlobAppend(pOut, zBuf, (sxu32)nRead);
		if( rc != SXRET_OK ){
			break;
		}
	}
	return SyBlobLength(pOut) > 0 ? SXRET_OK : -1;
}